

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md2.cpp
# Opt level: O0

bool __thiscall FMD2Model::Load(FMD2Model *this,char *path,int lumpnum,char *buffer,int length)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  FTextureID FVar5;
  ulong uVar6;
  ulong uVar7;
  FTextureID *pFVar8;
  ModelFrame *pMVar9;
  FTextureID *local_80;
  md2_packedFrame_t *pfr;
  int i;
  byte *md2_frames;
  ModelFrame *frame;
  md2_header_t *md2header;
  int length_local;
  char *buffer_local;
  int lumpnum_local;
  char *path_local;
  FMD2Model *this_local;
  
  (this->super_FDMDModel).header.magic = 0x32504449;
  (this->super_FDMDModel).header.version = 8;
  (this->super_FDMDModel).header.flags = 0;
  (this->super_FDMDModel).info.skinWidth = *(int *)(buffer + 8);
  (this->super_FDMDModel).info.skinHeight = *(int *)(buffer + 0xc);
  (this->super_FDMDModel).info.frameSize = *(int *)(buffer + 0x10);
  (this->super_FDMDModel).info.numLODs = 1;
  (this->super_FDMDModel).info.numSkins = *(int *)(buffer + 0x14);
  (this->super_FDMDModel).info.numTexCoords = *(int *)(buffer + 0x1c);
  (this->super_FDMDModel).info.numVertices = *(int *)(buffer + 0x18);
  (this->super_FDMDModel).info.numFrames = *(int *)(buffer + 0x28);
  (this->super_FDMDModel).info.offsetSkins = *(int *)(buffer + 0x2c);
  (this->super_FDMDModel).info.offsetTexCoords = *(int *)(buffer + 0x30);
  (this->super_FDMDModel).info.offsetFrames = *(int *)(buffer + 0x38);
  (this->super_FDMDModel).info.offsetLODs = *(int *)(buffer + 0x40);
  (this->super_FDMDModel).lodInfo[0].numTriangles = *(int *)(buffer + 0x20);
  (this->super_FDMDModel).lodInfo[0].numGlCommands = *(int *)(buffer + 0x24);
  (this->super_FDMDModel).lodInfo[0].offsetTriangles = *(int *)(buffer + 0x34);
  (this->super_FDMDModel).lodInfo[0].offsetGlCommands = *(int *)(buffer + 0x3c);
  (this->super_FDMDModel).info.offsetEnd = *(int *)(buffer + 0x40);
  if (length < (this->super_FDMDModel).info.offsetFrames +
               (this->super_FDMDModel).info.frameSize * (this->super_FDMDModel).info.numFrames) {
    Printf("LoadModel: Model \'%s\' file too short\n",path);
    this_local._7_1_ = false;
  }
  else if ((this->super_FDMDModel).lodInfo[0].numGlCommands < 1) {
    Printf("LoadModel: Model \'%s\' invalid NumGLCommands\n",path);
    this_local._7_1_ = false;
  }
  else {
    uVar6 = (ulong)(this->super_FDMDModel).info.numSkins;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    uVar7 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pFVar8 = (FTextureID *)operator_new__(uVar7);
    if (uVar6 != 0) {
      local_80 = pFVar8;
      do {
        FTextureID::FTextureID(local_80);
        local_80 = local_80 + 1;
      } while (local_80 != pFVar8 + uVar6);
    }
    (this->super_FDMDModel).skins = pFVar8;
    for (pfr._4_4_ = 0; pfr._4_4_ < (this->super_FDMDModel).info.numSkins; pfr._4_4_ = pfr._4_4_ + 1
        ) {
      FVar5 = LoadSkin(path,buffer + (long)(pfr._4_4_ << 6) +
                                     (long)(this->super_FDMDModel).info.offsetSkins);
      (this->super_FDMDModel).skins[pfr._4_4_].texnum = FVar5.texnum;
    }
    iVar1 = (this->super_FDMDModel).info.offsetFrames;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(this->super_FDMDModel).info.numFrames;
    uVar6 = SUB168(auVar3 * ZEXT816(0x14),0);
    if (SUB168(auVar3 * ZEXT816(0x14),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pMVar9 = (ModelFrame *)operator_new__(uVar6);
    (this->super_FDMDModel).frames = pMVar9;
    pfr._4_4_ = 0;
    md2_frames = (byte *)(this->super_FDMDModel).frames;
    for (; pfr._4_4_ < (this->super_FDMDModel).info.numFrames; pfr._4_4_ = pfr._4_4_ + 1) {
      lVar4 = (long)((this->super_FDMDModel).info.frameSize * pfr._4_4_) + (long)iVar1;
      *(undefined8 *)md2_frames = *(undefined8 *)(buffer + lVar4 + 0x18);
      *(undefined8 *)(md2_frames + 8) = *(undefined8 *)(buffer + lVar4 + 0x20);
      md2_frames[0x10] = 0xff;
      md2_frames[0x11] = 0xff;
      md2_frames[0x12] = 0xff;
      md2_frames[0x13] = 0xff;
      md2_frames = md2_frames + 0x14;
    }
    (this->super_FDMDModel).mLumpNum = lumpnum;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FMD2Model::Load(const char * path, int lumpnum, const char * buffer, int length)
{
	md2_header_t * md2header = (md2_header_t *)buffer;
	ModelFrame *frame;
	byte   *md2_frames;
	int     i;

	// Convert it to DMD.
	header.magic = MD2_MAGIC;
	header.version = 8;
	header.flags = 0;
	info.skinWidth = LittleLong(md2header->skinWidth);
	info.skinHeight = LittleLong(md2header->skinHeight);
	info.frameSize = LittleLong(md2header->frameSize);
	info.numLODs = 1;
	info.numSkins = LittleLong(md2header->numSkins);
	info.numTexCoords = LittleLong(md2header->numTexCoords);
	info.numVertices = LittleLong(md2header->numVertices);
	info.numFrames = LittleLong(md2header->numFrames);
	info.offsetSkins = LittleLong(md2header->offsetSkins);
	info.offsetTexCoords = LittleLong(md2header->offsetTexCoords);
	info.offsetFrames = LittleLong(md2header->offsetFrames);
	info.offsetLODs = LittleLong(md2header->offsetEnd);	// Doesn't exist.
	lodInfo[0].numTriangles = LittleLong(md2header->numTriangles);
	lodInfo[0].numGlCommands = LittleLong(md2header->numGlCommands);
	lodInfo[0].offsetTriangles = LittleLong(md2header->offsetTriangles);
	lodInfo[0].offsetGlCommands = LittleLong(md2header->offsetGlCommands);
	info.offsetEnd = LittleLong(md2header->offsetEnd);

	if (info.offsetFrames + info.frameSize * info.numFrames > length)
	{
		Printf("LoadModel: Model '%s' file too short\n", path);
		return false;
	}
	if (lodInfo[0].numGlCommands <= 0)
	{
		Printf("LoadModel: Model '%s' invalid NumGLCommands\n", path);
		return false;
	}

	skins = new FTextureID[info.numSkins];

	for (i = 0; i < info.numSkins; i++)
	{
		skins[i] = LoadSkin(path, buffer + info.offsetSkins + i * 64);
	}

	// The frames need to be unpacked.
	md2_frames = (byte*)buffer + info.offsetFrames;
	frames = new ModelFrame[info.numFrames];

	for (i = 0, frame = frames; i < info.numFrames; i++, frame++)
	{
		md2_packedFrame_t *pfr = (md2_packedFrame_t *)(md2_frames + info.frameSize * i);

		memcpy(frame->name, pfr->name, sizeof(pfr->name));
		frame->vindex = UINT_MAX;
	}
	mLumpNum = lumpnum;
	return true;
}